

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O2

int Smt_PrsBuildNode(Wlc_Ntk_t *pNtk,Smt_Prs_t *p,int iNode,int RangeOut,char *pName)

{
  undefined8 uVar1;
  Abc_Nam_t *p_00;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint Entry1;
  int iVar6;
  Vec_Int_t *vFans;
  char *pcVar7;
  char *pcVar8;
  undefined4 extraout_var;
  Vec_Int_t *pVVar9;
  undefined4 extraout_var_00;
  Wlc_Obj_t *pWVar10;
  int iVar11;
  int i;
  int local_b0;
  int local_ac;
  char *local_a8;
  undefined8 local_a0;
  int local_98 [26];
  
  iVar4 = 1;
  local_a8 = pName;
  do {
    iVar3 = Abc_LitIsCompl(iNode);
    if (iVar3 != 0) {
      p_00 = p->pStrs;
      iVar4 = Abc_Lit2Var(iNode);
      pcVar8 = Abc_NamStr(p_00,iVar4);
      if (*pcVar8 != '#' && 9 < (byte)(*pcVar8 - 0x30U)) {
        iVar4 = Abc_NamStrFindOrAdd(pNtk->pManName,pcVar8,local_98);
        if (local_98[0] != 0) {
          return iVar4;
        }
        __assert_fail("fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                      ,0x2a9,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
LAB_002ef02b:
      iVar4 = Smt_PrsBuildConstant(pNtk,pcVar8,RangeOut,local_a8);
      return iVar4;
    }
    vFans = Smt_EntryNode(p,iNode);
    pcVar7 = Smt_VecEntryName(p,vFans,0);
    pcVar8 = Smt_VecEntryName(p,vFans,1);
    if (pcVar8 == (char *)0x0 || pcVar7 == (char *)0x0) {
      if (pcVar7 != (char *)0x0) {
        cVar2 = *pcVar7;
        goto LAB_002eef90;
      }
LAB_002ef11e:
      iVar3 = Vec_IntEntry(vFans,0);
      iVar5 = Abc_LitIsCompl(iVar3);
      if (iVar5 == 0) {
        pVVar9 = Smt_EntryNode(p,iVar3);
        pcVar7 = Smt_VecEntryName(p,pVVar9,0);
        if (pVVar9->nSize < 3) {
          __assert_fail("Vec_IntSize(vFans) >= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,0xf8,"int Smt_PrsReadType(Smt_Prs_t *, int, int *, int *, int *)");
        }
        if ((*pcVar7 != '_') || (pcVar7[1] != '\0')) {
          __assert_fail("!strcmp(pStr, \"_\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,0xf9,"int Smt_PrsReadType(Smt_Prs_t *, int, int *, int *, int *)");
        }
        pcVar7 = Smt_VecEntryName(p,pVVar9,1);
        iVar3 = Smt_StrToType(pcVar7,&local_ac);
        local_a0 = CONCAT44(extraout_var_00,iVar3);
        if (iVar3 == 0) {
          local_a0 = 0;
          local_b0 = -1;
          Entry1 = 0xffffffff;
        }
        else {
          pcVar7 = Smt_VecEntryName(p,pVVar9,2);
          Entry1 = atoi(pcVar7);
          if (pVVar9->nSize < 4) {
            local_b0 = -1;
          }
          else {
            pcVar7 = Smt_VecEntryName(p,pVVar9,3);
            local_b0 = atoi(pcVar7);
          }
        }
      }
      else {
        pcVar7 = Smt_EntryName(p,iVar3);
        iVar3 = Smt_StrToType(pcVar7,&local_ac);
        local_a0 = CONCAT44(extraout_var,iVar3);
        Entry1 = 0xffffffff;
        local_b0 = -1;
      }
      pVVar9 = Vec_IntAlloc(100);
      for (; iVar4 < vFans->nSize; iVar4 = iVar4 + 1) {
        iVar3 = Vec_IntEntry(vFans,iVar4);
        iVar3 = Smt_PrsBuildNode(pNtk,p,iVar3,-1,(char *)0x0);
        if (iVar3 == 0) {
          Vec_IntFree(pVVar9);
          return 0;
        }
        Vec_IntPush(pVVar9,iVar3);
      }
      iVar4 = (int)local_a0;
      if (0xfffffffd < iVar4 - 0x1aU) {
        __assert_fail("Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                      ,0x2e5,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
      if (iVar4 == 0x16) {
        if ((((int)Entry1 < 0) || (local_b0 < 0)) || ((int)Entry1 < local_b0)) {
          __assert_fail("Value1 >= 0 && Value2 >= 0 && Value1 >= Value2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,0x2e8,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        Vec_IntPushTwo(pVVar9,Entry1,local_b0);
        iVar5 = (Entry1 - local_b0) + 1;
LAB_002ef1f4:
        pcVar7 = local_a8;
        if (iVar5 < 1) {
          __assert_fail("Range > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,0x30c,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
      }
      else {
        if (iVar4 - 0xdU < 2) {
          if ((int)Entry1 < 0) {
            __assert_fail("Value1 >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                          ,0x2ee,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)")
            ;
          }
          sprintf((char *)local_98,"%d",(ulong)Entry1);
          iVar3 = Smt_PrsBuildConstant(pNtk,(char *)local_98,-1,(char *)0x0);
          Vec_IntPush(pVVar9,iVar3);
        }
        if (iVar4 - 0x1aU < 0xe) {
          iVar5 = 1;
          pcVar7 = local_a8;
          goto LAB_002ef3ed;
        }
        if (iVar4 == 8) {
          if (pVVar9->nSize != 3) {
            __assert_fail("Vec_IntSize(vFanins) == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                          ,0x301,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)")
            ;
          }
          uVar1 = *(undefined8 *)(pVVar9->pArray + 1);
          *(ulong *)(pVVar9->pArray + 1) = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
          iVar3 = 1;
        }
        else {
          if (iVar4 == 0x17) {
            iVar3 = pVVar9->nSize;
            iVar5 = 0;
            for (i = 0; i < iVar3; i = i + 1) {
              iVar6 = Vec_IntEntry(pVVar9,i);
              pWVar10 = Wlc_NtkObj(pNtk,iVar6);
              iVar11 = pWVar10->End - pWVar10->Beg;
              iVar6 = -iVar11;
              if (0 < iVar11) {
                iVar6 = iVar11;
              }
              iVar5 = iVar5 + iVar6 + 1;
            }
            goto LAB_002ef1f4;
          }
          iVar3 = 0;
        }
        iVar3 = Vec_IntEntry(pVVar9,iVar3);
        pWVar10 = Wlc_NtkObj(pNtk,iVar3);
        iVar3 = pWVar10->End - pWVar10->Beg;
        iVar5 = -iVar3;
        if (0 < iVar3) {
          iVar5 = iVar3;
        }
        iVar5 = iVar5 + 1;
        pcVar7 = local_a8;
      }
LAB_002ef3ed:
      iVar4 = Smt_PrsCreateNode(pNtk,iVar4,local_ac,iVar5,pVVar9,pcVar7);
      Vec_IntFree(pVVar9);
      return iVar4;
    }
    cVar2 = *pcVar7;
    if (cVar2 == '_') {
      if ((*pcVar8 != 'b') || (pcVar8[1] != 'v')) goto LAB_002ef11e;
      pcVar7 = Smt_VecEntryName(p,vFans,2);
      if (vFans->nSize != 3) {
        __assert_fail("Vec_IntSize(vFans) == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                      ,0x2b6,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
      pcVar8 = pcVar8 + 2;
      RangeOut = atoi(pcVar7);
      goto LAB_002ef02b;
    }
LAB_002eef90:
    if (cVar2 != '=') goto LAB_002ef11e;
    if (vFans->nSize != 3) {
      __assert_fail("Vec_IntSize(vFans) == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                    ,699,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
    }
    iVar3 = Vec_IntEntry(vFans,2);
    iVar5 = Abc_LitIsCompl(iVar3);
    if (iVar5 == 0) {
      __assert_fail("Smt_EntryIsName(iNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                    ,0x2bd,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
    }
    pcVar7 = Smt_EntryName(p,iVar3);
    iVar3 = strcmp("#b1",pcVar7);
    if (iVar3 != 0) {
      pVVar9 = Vec_IntAlloc(2);
      iVar4 = Smt_PrsBuildConstant(pNtk,pcVar7,-1,(char *)0x0);
      iVar5 = 1;
      iVar3 = Vec_IntEntry(vFans,1);
      pcVar7 = local_a8;
      iVar3 = Smt_PrsBuildNode(pNtk,p,iVar3,-1,local_a8);
      Vec_IntPushTwo(pVVar9,iVar3,iVar4);
      iVar4 = 0x1f;
      local_ac = 0;
      goto LAB_002ef3ed;
    }
    iNode = Vec_IntEntry(vFans,1);
    RangeOut = -1;
  } while( true );
}

Assistant:

int Smt_PrsBuildNode( Wlc_Ntk_t * pNtk, Smt_Prs_t * p, int iNode, int RangeOut, char * pName )
{
    if ( Smt_EntryIsName(iNode) ) // name or constant
    {
        char * pStr = Abc_NamStr(p->pStrs, Abc_Lit2Var(iNode));
        if ( (pStr[0] >= '0' && pStr[0] <= '9') || pStr[0] == '#' )
        { 
            // (_ BitVec 8) #x19
            return Smt_PrsBuildConstant( pNtk, pStr, RangeOut, pName );
        }
        else
        {
            // s3087
            int fFound, iObj = Abc_NamStrFindOrAdd( pNtk->pManName, pStr, &fFound );
            assert( fFound );
            return iObj;
        }
    }
    else // node
    {
        Vec_Int_t * vFans = Smt_EntryNode( p, iNode );
        char * pStr0 = Smt_VecEntryName( p, vFans, 0 );
        char * pStr1 = Smt_VecEntryName( p, vFans, 1 );
        if ( pStr0 && pStr1 && pStr0[0] == '_' && pStr1[0] == 'b' && pStr1[1] == 'v' )
        {
            // (_ bv1 32)
            char * pStr2 = Smt_VecEntryName( p, vFans, 2 );
            assert( Vec_IntSize(vFans) == 3 );
            return Smt_PrsBuildConstant( pNtk, pStr1+2, atoi(pStr2), pName );
        }
        else if ( pStr0 && pStr0[0] == '=' )
        {
            assert( Vec_IntSize(vFans) == 3 );
            iNode = Vec_IntEntry(vFans, 2);
            assert( Smt_EntryIsName(iNode) );
            pStr0 = Smt_EntryName(p, iNode);
            // check the last one is "#b1"
            if ( !strcmp("#b1", pStr0) )
            {
                iNode = Vec_IntEntry(vFans, 1);
                return Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
            }
            else
            {
                Vec_Int_t * vFanins = Vec_IntAlloc( 2 );
                // get the constant
                int iObj, iOper, iConst = Smt_PrsBuildConstant( pNtk, pStr0, -1, NULL );
                // check the middle one is an operator
                iNode = Vec_IntEntry(vFans, 1);
                iOper = Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
                // build comparator
                Vec_IntPushTwo( vFanins, iOper, iConst );
                iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_COMP_EQU, 0, 1, vFanins, pName );
                Vec_IntFree( vFanins );
                return iObj;
            }
        }
        else
        {
            int i, Fan, NameId, iFanin, fSigned, Range, Value1 = -1, Value2 = -1;
            int Type = Smt_PrsReadType( p, Vec_IntEntry(vFans, 0), &fSigned, &Value1, &Value2 );
            // collect fanins
            Vec_Int_t * vFanins = Vec_IntAlloc( 100 );
            Vec_IntForEachEntryStart( vFans, Fan, i, 1 )
            {
                iFanin = Smt_PrsBuildNode( pNtk, p, Fan, -1, NULL );
                if ( iFanin == 0 )
                {
                    Vec_IntFree( vFanins );
                    return 0;
                }
                Vec_IntPush( vFanins, iFanin );
            }
            // update specialized nodes
            assert( Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD );
            if ( Type == WLC_OBJ_BIT_SELECT )
            {
                assert( Value1 >= 0 && Value2 >= 0 && Value1 >= Value2 );
                Vec_IntPushTwo( vFanins, Value1, Value2 );
            }
            else if ( Type == WLC_OBJ_ROTATE_R || Type == WLC_OBJ_ROTATE_L )
            {
                char Buffer[100];
                assert( Value1 >= 0 );
                sprintf( Buffer, "%d", Value1 ); 
                NameId = Smt_PrsBuildConstant( pNtk, Buffer, -1, NULL );
                Vec_IntPush( vFanins, NameId );
            }
            // find range
            Range = 0;
            if ( Type >= WLC_OBJ_LOGIC_NOT && Type <= WLC_OBJ_REDUCT_XOR )
                Range = 1;
            else if ( Type == WLC_OBJ_BIT_SELECT )
                Range = Value1 - Value2 + 1;
            else if ( Type == WLC_OBJ_BIT_CONCAT )
            {
                Vec_IntForEachEntry( vFanins, NameId, i )
                    Range += Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else if ( Type == WLC_OBJ_MUX )
            {
                int * pArray = Vec_IntArray(vFanins);
                assert( Vec_IntSize(vFanins) == 3 );
                ABC_SWAP( int, pArray[1], pArray[2] );
                NameId = Vec_IntEntry(vFanins, 1);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else // to determine range, look at the first argument
            {
                NameId = Vec_IntEntry(vFanins, 0);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            // create node
            assert( Range > 0 );
            NameId = Smt_PrsCreateNode( pNtk, Type, fSigned, Range, vFanins, pName );
            Vec_IntFree( vFanins );
            return NameId;
        }
    }
}